

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O3

_Bool alloc_tensor_range(ggml_context *ctx,ggml_tensor *first,ggml_tensor *last,
                        ggml_backend_buffer_type_t buft,size_t size,ggml_backend_buffer_t **buffers,
                        size_t *n_buffers)

{
  size_t sVar1;
  ggml_status gVar2;
  ggml_backend_buffer_t buffer;
  ggml_backend_buffer_t *ppgVar3;
  void *pvVar4;
  char *pcVar5;
  _Bool _Var6;
  ggml_tallocr local_50;
  
  buffer = ggml_backend_buft_alloc_buffer(buft,size);
  if (buffer == (ggml_backend_buffer_t)0x0) {
    pcVar5 = ggml_backend_buft_name(buft);
    ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %s buffer of size %zu\n",
                      "alloc_tensor_range",pcVar5,size);
LAB_00124cfc:
    _Var6 = false;
    free_buffers(buffers,n_buffers);
  }
  else {
    ppgVar3 = (ggml_backend_buffer_t *)realloc(*buffers,*n_buffers * 8 + 8);
    *buffers = ppgVar3;
    sVar1 = *n_buffers;
    *n_buffers = sVar1 + 1;
    ppgVar3[sVar1] = buffer;
    pvVar4 = ggml_backend_buffer_get_base(buffer);
    local_50.alignment = ggml_backend_buffer_get_alignment(buffer);
    local_50.offset = (local_50.alignment - (ulong)pvVar4 % local_50.alignment) % local_50.alignment
    ;
    _Var6 = true;
    if (first != last) {
      local_50.buffer = buffer;
      local_50.base = pvVar4;
      do {
        if (first->data == (void *)0x0) {
          if (first->view_src != (ggml_tensor *)0x0) goto LAB_00124c6e;
          gVar2 = ggml_tallocr_alloc(&local_50,first);
LAB_00124c8a:
          if (gVar2 != GGML_STATUS_SUCCESS) {
            ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to initialize tensor %s\n",
                              "alloc_tensor_range",first->name);
            goto LAB_00124cfc;
          }
        }
        else if (first->view_src != (ggml_tensor *)0x0) {
LAB_00124c6e:
          if (first->buffer == (ggml_backend_buffer *)0x0) {
            gVar2 = ggml_backend_view_init(first);
            goto LAB_00124c8a;
          }
        }
        first = ggml_get_next_tensor(ctx,first);
      } while (first != last);
    }
  }
  return _Var6;
}

Assistant:

static bool alloc_tensor_range(struct ggml_context * ctx,
        struct ggml_tensor * first, struct ggml_tensor * last,
        ggml_backend_buffer_type_t buft, size_t size,
        ggml_backend_buffer_t ** buffers, size_t * n_buffers) {

    ggml_backend_buffer_t buffer = ggml_backend_buft_alloc_buffer(buft, size);
    if (buffer == NULL) {
        GGML_LOG_ERROR("%s: failed to allocate %s buffer of size %zu\n", __func__, ggml_backend_buft_name(buft), size);
        free_buffers(buffers, n_buffers);
        return false;
    }

    *buffers = realloc(*buffers, sizeof(ggml_backend_buffer_t) * (*n_buffers + 1));
    (*buffers)[(*n_buffers)++] = buffer;

    struct ggml_tallocr tallocr = ggml_tallocr_new(buffer);

    for (struct ggml_tensor * t = first; t != last; t = ggml_get_next_tensor(ctx, t)) {
        enum ggml_status status = GGML_STATUS_SUCCESS;
        if (t->data == NULL) {
            if (t->view_src == NULL) {
                status = ggml_tallocr_alloc(&tallocr, t);
            } else if (t->buffer == NULL) {
                status = ggml_backend_view_init(t);
            }
        } else {
            if (t->view_src != NULL && t->buffer == NULL) {
                // view of a pre-allocated tensor
                status = ggml_backend_view_init(t);
            }
        }
        if (status != GGML_STATUS_SUCCESS) {
            GGML_LOG_ERROR("%s: failed to initialize tensor %s\n", __func__, t->name);
            free_buffers(buffers, n_buffers);
            return false;
        }
    }

    return true;
}